

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O0

Rect * __thiscall
RTree<int,_double,_2,_double,_8,_4>::CombineRect
          (RTree<int,_double,_2,_double,_8,_4> *this,Rect *a_rectA,Rect *a_rectB)

{
  double *pdVar1;
  long in_RCX;
  long in_RDX;
  Rect *in_RDI;
  int index;
  int local_1c;
  
  if (in_RDX == 0 || in_RCX == 0) {
    __assert_fail("a_rectA && a_rectB",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Oxer11[P]Geo-fencing/yourcode/RTree.h"
                  ,0x476,
                  "typename RTree<DATATYPE, ELEMTYPE, NUMDIMS, ELEMTYPEREAL, TMAXNODES, TMINNODES>::Rect RTree<int, double, 2>::CombineRect(const Rect *, const Rect *) [DATATYPE = int, ELEMTYPE = double, NUMDIMS = 2, ELEMTYPEREAL = double, TMAXNODES = 8, TMINNODES = 4]"
                 );
  }
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    pdVar1 = std::min<double>((double *)(in_RDX + (long)local_1c * 8),
                              (double *)(in_RCX + (long)local_1c * 8));
    in_RDI->m_min[local_1c] = *pdVar1;
    pdVar1 = std::max<double>((double *)(in_RDX + 0x10 + (long)local_1c * 8),
                              (double *)(in_RCX + 0x10 + (long)local_1c * 8));
    in_RDI->m_max[local_1c] = *pdVar1;
  }
  return in_RDI;
}

Assistant:

RTREE_TEMPLATE
typename RTREE_QUAL::Rect RTREE_QUAL::CombineRect(const Rect* a_rectA, const Rect* a_rectB)
{
  ASSERT(a_rectA && a_rectB);

  Rect newRect;

  for(int index = 0; index < NUMDIMS; ++index)
  {
    newRect.m_min[index] = Min(a_rectA->m_min[index], a_rectB->m_min[index]);
    newRect.m_max[index] = Max(a_rectA->m_max[index], a_rectB->m_max[index]);
  }

  return newRect;
}